

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

int OPENSSL_sk_find(OPENSSL_STACK *sk,size_t *out_index,void *p,
                   OPENSSL_sk_call_cmp_func call_cmp_func)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_001adbab:
    bVar7 = false;
  }
  else {
    if (sk->comp == (OPENSSL_sk_cmp_func)0x0) {
      uVar5 = sk->num;
      bVar7 = uVar5 != 0;
      if (uVar5 == 0) goto LAB_001adbad;
      if (*sk->data == p) {
LAB_001adbc5:
        uVar6 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (uVar5 - 1 == uVar4) goto LAB_001adbab;
          uVar6 = uVar4 + 1;
          lVar2 = uVar4 + 1;
          uVar4 = uVar6;
        } while (sk->data[lVar2] != p);
        bVar7 = uVar6 < uVar5;
      }
    }
    else {
      if (p == (void *)0x0) goto LAB_001adbab;
      if ((sk->sorted != 0) || (sk->num < 2)) {
        uVar5 = 0;
        sVar3 = sk->num;
        do {
          lVar2 = sVar3 - uVar5;
          if (sVar3 < uVar5 || lVar2 == 0) {
            if (lVar2 != 0) {
              __assert_fail("lo == hi",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                            ,0x129,
                            "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                           );
            }
            goto LAB_001adbab;
          }
          uVar4 = (lVar2 - 1U >> 1) + uVar5;
          if ((uVar4 < uVar5) || (sVar3 <= uVar4)) {
            __assert_fail("lo <= mid && mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                          ,0x113,
                          "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                         );
          }
          iVar1 = (*call_cmp_func)(sk->comp,p,sk->data[uVar4]);
          if (iVar1 < 1) {
            bVar7 = true;
            if (-1 < iVar1) {
              if (lVar2 == 1) {
                if (out_index != (size_t *)0x0) {
                  *out_index = uVar4;
                }
                bVar7 = false;
                uVar4 = sVar3;
              }
              else {
                uVar4 = uVar4 + 1;
                if (sVar3 <= uVar4) {
                  __assert_fail("mid + 1 < hi",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                                ,0x124,
                                "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                               );
                }
              }
            }
          }
          else {
            uVar5 = uVar4 + 1;
            bVar7 = true;
            uVar4 = sVar3;
          }
          sVar3 = uVar4;
        } while (bVar7);
        bVar7 = true;
        goto LAB_001adbad;
      }
      bVar8 = sk->num == 0;
      bVar7 = !bVar8;
      if (bVar8) goto LAB_001adbad;
      iVar1 = (*call_cmp_func)(sk->comp,p,*sk->data);
      if (iVar1 == 0) goto LAB_001adbc5;
      uVar5 = 1;
      do {
        uVar6 = uVar5;
        bVar7 = uVar6 < sk->num;
        if (!bVar7) goto LAB_001adbad;
        iVar1 = (*call_cmp_func)(sk->comp,p,sk->data[uVar6]);
        uVar5 = uVar6 + 1;
      } while (iVar1 != 0);
    }
    if (out_index != (size_t *)0x0) {
      *out_index = uVar6;
    }
  }
LAB_001adbad:
  return (int)bVar7;
}

Assistant:

int OPENSSL_sk_find(const OPENSSL_STACK *sk, size_t *out_index, const void *p,
                    OPENSSL_sk_call_cmp_func call_cmp_func) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->comp == NULL) {
    // Use pointer equality when no comparison function has been set.
    for (size_t i = 0; i < sk->num; i++) {
      if (sk->data[i] == p) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  if (p == NULL) {
    return 0;
  }

  if (!OPENSSL_sk_is_sorted(sk)) {
    for (size_t i = 0; i < sk->num; i++) {
      if (call_cmp_func(sk->comp, p, sk->data[i]) == 0) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  // The stack is sorted, so binary search to find the element.
  //
  // |lo| and |hi| maintain a half-open interval of where the answer may be. All
  // indices such that |lo <= idx < hi| are candidates.
  size_t lo = 0, hi = sk->num;
  while (lo < hi) {
    // Bias |mid| towards |lo|. See the |r == 0| case below.
    size_t mid = lo + (hi - lo - 1) / 2;
    assert(lo <= mid && mid < hi);
    int r = call_cmp_func(sk->comp, p, sk->data[mid]);
    if (r > 0) {
      lo = mid + 1;  // |mid| is too low.
    } else if (r < 0) {
      hi = mid;  // |mid| is too high.
    } else {
      // |mid| matches. However, this function returns the earliest match, so we
      // can only return if the range has size one.
      if (hi - lo == 1) {
        if (out_index != NULL) {
          *out_index = mid;
        }
        return 1;
      }
      // The sample is biased towards |lo|. |mid| can only be |hi - 1| if
      // |hi - lo| was one, so this makes forward progress.
      assert(mid + 1 < hi);
      hi = mid + 1;
    }
  }

  assert(lo == hi);
  return 0;  // Not found.
}